

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

QList<QSslCipher> * QSslSocketPrivate::defaultDtlsCiphers(void)

{
  long lVar1;
  QMutexLocker<QMutex> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
  *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ensureInitialized();
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            (in_stack_ffffffffffffffb8);
  QMutexLocker<QMutex>::QMutexLocker(in_RDI,(QMutex *)in_stack_ffffffffffffffb8);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            (in_stack_ffffffffffffffb8);
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::operator->
            ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)0x3a5a12);
  QList<QSslCipher>::QList
            ((QList<QSslCipher> *)in_RDI,(QList<QSslCipher> *)in_stack_ffffffffffffffb8);
  QMutexLocker<QMutex>::~QMutexLocker(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QList<QSslCipher> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSslCipher> QSslSocketPrivate::defaultDtlsCiphers()
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);
    return globalData()->dtlsConfig->ciphers;
}